

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

void end_element_handler(void *data,char *el)

{
  long *plVar1;
  coda_type_record *pcVar2;
  coda_type_special *definition;
  coda_mem_array *pcVar3;
  int iVar4;
  ulong uVar5;
  coda_type_text *pcVar6;
  coda_mem_data *type;
  coda_mem_data *pcVar7;
  long lVar8;
  long lVar9;
  coda_type *type_00;
  
  if (*(int *)((long)data + 8) != 0) {
    return;
  }
  lVar8 = (long)*(int *)((long)data + 0x18);
  type = *(coda_mem_data **)((long)data + lVar8 * 8 + 0x120);
  if (type == (coda_mem_data *)0x0) {
LAB_00166aec:
    definition = (coda_type_special *)**(undefined8 **)((long)data + lVar8 * 8 + 0x20);
    if (definition->type_class == coda_special_class) {
      if (*(int *)((long)data + 0x428) != 0) {
        __assert_fail("!info->update_definition",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x26d,"void end_element_handler(void *, const char *)");
      }
      type = coda_mem_data_new(definition->base_type,(coda_dynamic_type *)0x0,
                               *(coda_product **)((long)data + 0x10),*(long *)((long)data + 0x430),
                               *(uint8_t **)((long)data + 0x440));
      if (type != (coda_mem_data *)0x0) {
        pcVar7 = (coda_mem_data *)
                 coda_mem_time_new(definition,*(coda_dynamic_type **)((long)data + 0x420),
                                   (coda_dynamic_type *)type);
        if (pcVar7 != (coda_mem_data *)0x0) goto LAB_00166b73;
        goto LAB_00166bc0;
      }
    }
    else {
      pcVar7 = coda_mem_data_new((coda_type *)definition,*(coda_dynamic_type **)((long)data + 0x420)
                                 ,*(coda_product **)((long)data + 0x10),
                                 *(long *)((long)data + 0x430),*(uint8_t **)((long)data + 0x440));
      if (pcVar7 != (coda_mem_data *)0x0) {
LAB_00166b73:
        *(undefined8 *)((long)data + 0x420) = 0;
        type = pcVar7;
        goto LAB_00166b81;
      }
    }
LAB_00166bc5:
    coda_XML_StopParser(*data,'\0');
    *(undefined4 *)((long)data + 8) = 1;
  }
  else {
    if (0 < *(long *)((long)data + 0x430)) {
      iVar4 = is_whitespace(*(char **)((long)data + 0x440),(int)*(long *)((long)data + 0x430));
      if (iVar4 == 0) {
        if (*(int *)((long)data + 0x428) == 0) {
          __assert_fail("info->update_definition",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                        ,0x250,"void end_element_handler(void *, const char *)");
        }
        lVar9 = (long)*(int *)((long)data + 0x18);
        lVar8 = *(long *)((long)data + lVar9 * 8 + 0x120);
        if (*(long *)(*(long *)(lVar8 + 8) + 0x48) < 1) {
          *(undefined8 *)((long)data + 0x420) = *(undefined8 *)(lVar8 + 0x18);
          *(undefined8 *)(*(long *)((long)data + lVar9 * 8 + 0x120) + 0x18) = 0;
          plVar1 = *(long **)((long)data + lVar9 * 8 + 0x20);
          if ((((int *)*plVar1)[2] != 0) || (*(int *)*plVar1 != 2)) {
            __assert_fail("(*definition)->type_class == coda_record_class && (*definition)->format == coda_format_xml"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                          ,0x46,"int convert_to_text(coda_type **)");
          }
          pcVar6 = coda_type_text_new(coda_format_xml);
          if (pcVar6 != (coda_type_text *)0x0) {
            type_00 = (coda_type *)*plVar1;
            pcVar2 = type_00->attributes;
            if (pcVar2 != (coda_type_record *)0x0) {
              pcVar6->attributes = pcVar2;
              pcVar2->retain_count = pcVar2->retain_count + 1;
              type_00 = (coda_type *)*plVar1;
            }
            coda_type_release(type_00);
            *plVar1 = (long)pcVar6;
            coda_dynamic_type_delete
                      (*(coda_dynamic_type **)
                        ((long)data + (long)*(int *)((long)data + 0x18) * 8 + 0x120));
            lVar8 = (long)*(int *)((long)data + 0x18);
            *(undefined8 *)((long)data + lVar8 * 8 + 0x120) = 0;
            goto LAB_00166aec;
          }
        }
        else {
          coda_set_error(-300,"mixed content for element \'%s\' is not supported",
                         *(undefined8 *)((long)data + lVar9 * 8 + 800));
        }
        goto LAB_00166bc5;
      }
      lVar8 = (long)*(int *)((long)data + 0x18);
      type = *(coda_mem_data **)((long)data + lVar8 * 8 + 0x120);
      if (type == (coda_mem_data *)0x0) goto LAB_00166aec;
    }
    if (*(int *)((long)data + 0x428) == 0) {
      iVar4 = coda_mem_record_validate((coda_mem_record *)type);
      if (iVar4 != 0) goto LAB_00166bc5;
      uVar5 = (ulong)*(uint *)((long)data + 0x18);
      lVar8 = (long)(int)*(uint *)((long)data + 0x18);
      type = *(coda_mem_data **)((long)data + lVar8 * 8 + 0x120);
      if (0 < type->length) {
        lVar9 = 0;
        do {
          pcVar3 = *(coda_mem_array **)(type->offset + lVar9 * 8);
          if (((pcVar3 != (coda_mem_array *)0x0) &&
              (pcVar3->definition->type_class == coda_array_class)) &&
             (pcVar3->definition->format == coda_format_xml)) {
            iVar4 = coda_mem_array_validate(pcVar3);
            if (iVar4 != 0) goto LAB_00166bc5;
            uVar5 = (ulong)*(uint *)((long)data + 0x18);
            if ((pcVar3->num_elements == 0) &&
               (*(char *)(*(long *)(*(long *)(*(long *)(*(long *)((long)data +
                                                                 (long)(int)*(uint *)((long)data +
                                                                                     0x18) * 8 +
                                                                 0x120) + 8) + 0x50) + lVar9 * 8) +
                         0x1c) != '\0')) {
              coda_mem_type_delete((coda_dynamic_type *)pcVar3);
              uVar5 = (ulong)*(int *)((long)data + 0x18);
              *(undefined8 *)
               (*(long *)(*(long *)((long)data + uVar5 * 8 + 0x120) + 0x28) + lVar9 * 8) = 0;
            }
          }
          lVar9 = lVar9 + 1;
          lVar8 = (long)(int)uVar5;
          type = *(coda_mem_data **)((long)data + lVar8 * 8 + 0x120);
        } while (lVar9 < type->length);
      }
    }
    *(undefined8 *)((long)data + lVar8 * 8 + 0x120) = 0;
    if (*(long *)((long)data + 0x420) != 0) {
      __assert_fail("info->attributes == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                    ,0x2b6,"void end_element_handler(void *, const char *)");
    }
LAB_00166b81:
    iVar4 = *(int *)((long)data + 0x18);
    lVar9 = (long)*(int *)((long)data + (long)iVar4 * 8 + 0x220);
    lVar8 = *(long *)(*(long *)((long)data + (long)iVar4 * 8 + 0x118) + 0x28);
    pcVar3 = *(coda_mem_array **)(lVar8 + lVar9 * 8);
    if (pcVar3 == (coda_mem_array *)0x0) {
      *(coda_mem_data **)(lVar8 + lVar9 * 8) = type;
    }
    else {
      if ((pcVar3->definition->type_class != coda_array_class) ||
         (pcVar3->definition->format != coda_format_xml)) {
        __assert_fail("parent->field_type[index]->definition->type_class == coda_array_class && parent->field_type[index]->definition->format == coda_format_xml"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                      ,0x2be,"void end_element_handler(void *, const char *)");
      }
      iVar4 = coda_mem_array_add_element(pcVar3,(coda_dynamic_type *)type);
      if (iVar4 != 0) {
LAB_00166bc0:
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        goto LAB_00166bc5;
      }
      iVar4 = *(int *)((long)data + 0x18);
    }
    *(int *)((long)data + 0x18) = iVar4 + -1;
    *(undefined8 *)((long)data + 0x430) = 0;
  }
  return;
}

Assistant:

static void XMLCALL end_element_handler(void *data, const char *el)
{
    parser_info *info = (parser_info *)data;

    (void)el;

    if (info->abort_parser)
    {
        return;
    }

    if (info->unparsed_depth > 0)
    {
        info->unparsed_depth--;
        return;
    }

    if (pop_node(info) != 0)
    {
        abort_parser(info);
    }
}